

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlSimulate(Fra_Man_t *p,int fInit)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  timespec ts;
  timespec local_48;
  int local_34;
  
  local_34 = fInit;
  if ((fInit != 0) && (p->pManAig->nRegs == 0)) {
    __assert_fail("!fInit || Aig_ManRegNum(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x2e7,"void Fra_SmlSimulate(Fra_Man_t *, int)");
  }
  Fra_SmlInitialize(p->pSml,fInit);
  Fra_SmlSimulateOne(p->pSml);
  if ((p->pPars->fProve != 0) && (iVar2 = Fra_SmlCheckOutput(p), iVar2 != 0)) {
    return;
  }
  Fra_ClassesPrepare(p->pCla,p->pPars->fLatchCorr,0);
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  Fra_SmlAssignDist1(p->pSml,p->pPatWords);
  Fra_SmlSimulateOne(p->pSml);
  if ((p->pPars->fProve != 0) && (iVar2 = Fra_SmlCheckOutput(p), iVar2 != 0)) {
    return;
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Fra_ClassesRefine(p->pCla);
  Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeRef = p->timeRef + lVar7 + lVar6;
  Fra_SmlSavePattern1(p,local_34);
  Fra_SmlAssignDist1(p->pSml,p->pPatWords);
  Fra_SmlSimulateOne(p->pSml);
  if ((p->pPars->fProve != 0) && (iVar2 = Fra_SmlCheckOutput(p), iVar2 != 0)) {
    return;
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  Fra_ClassesRefine(p->pCla);
  Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeRef = p->timeRef + lVar7 + lVar6;
  do {
    Fra_SmlInitialize(p->pSml,local_34);
    Fra_SmlSimulateOne(p->pSml);
    iVar2 = p->pCla->vClasses->nSize;
    if ((p->pPars->fProve != 0) && (iVar3 = Fra_SmlCheckOutput(p), iVar3 != 0)) {
      return;
    }
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
    }
    iVar3 = Fra_ClassesRefine(p->pCla);
    iVar4 = Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
    iVar5 = clock_gettime(3,&local_48);
    if (iVar5 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeRef = p->timeRef + lVar7 + lVar6;
    dVar8 = (double)(iVar4 + iVar3) / (double)iVar2;
    pdVar1 = &p->pPars->dSimSatur;
  } while (*pdVar1 <= dVar8 && dVar8 != *pdVar1);
  return;
}

Assistant:

void Fra_SmlSimulate( Fra_Man_t * p, int fInit )
{
    int fVerbose = 0;
    int nChanges, nClasses;
    abctime clk;
    assert( !fInit || Aig_ManRegNum(p->pManAig) );
    // start the classes
    Fra_SmlInitialize( p->pSml, fInit );
    Fra_SmlSimulateOne( p->pSml );
    if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
        return;
    Fra_ClassesPrepare( p->pCla, p->pPars->fLatchCorr, 0 );
//    Fra_ClassesPrint( p->pCla, 0 );
if ( fVerbose )
printf( "Starting classes = %5d.   Lits = %6d.\n", Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );

//return;

    // refine classes by walking 0/1 patterns
    Fra_SmlSavePattern0( p, fInit );
    Fra_SmlAssignDist1( p->pSml, p->pPatWords );
    Fra_SmlSimulateOne( p->pSml );
    if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
        return;
clk = Abc_Clock();
    nChanges = Fra_ClassesRefine( p->pCla );
    nChanges += Fra_ClassesRefine1( p->pCla, 1, NULL );
p->timeRef += Abc_Clock() - clk;
if ( fVerbose )
printf( "Refined classes  = %5d.   Changes = %4d.   Lits = %6d.\n", Vec_PtrSize(p->pCla->vClasses), nChanges, Fra_ClassesCountLits(p->pCla) );
    Fra_SmlSavePattern1( p, fInit );
    Fra_SmlAssignDist1( p->pSml, p->pPatWords );
    Fra_SmlSimulateOne( p->pSml );
    if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
        return;
clk = Abc_Clock();
    nChanges = Fra_ClassesRefine( p->pCla );
    nChanges += Fra_ClassesRefine1( p->pCla, 1, NULL );
p->timeRef += Abc_Clock() - clk;

if ( fVerbose )
printf( "Refined classes  = %5d.   Changes = %4d.   Lits = %6d.\n", Vec_PtrSize(p->pCla->vClasses), nChanges, Fra_ClassesCountLits(p->pCla) );
    // refine classes by random simulation
    do {
        Fra_SmlInitialize( p->pSml, fInit );
        Fra_SmlSimulateOne( p->pSml );
        nClasses = Vec_PtrSize(p->pCla->vClasses);
        if ( p->pPars->fProve && Fra_SmlCheckOutput(p) )
            return;
clk = Abc_Clock();
        nChanges = Fra_ClassesRefine( p->pCla );
        nChanges += Fra_ClassesRefine1( p->pCla, 1, NULL );
p->timeRef += Abc_Clock() - clk;
if ( fVerbose )
printf( "Refined classes  = %5d.   Changes = %4d.   Lits = %6d.\n", Vec_PtrSize(p->pCla->vClasses), nChanges, Fra_ClassesCountLits(p->pCla) );
    } while ( (double)nChanges / nClasses > p->pPars->dSimSatur );

//    if ( p->pPars->fVerbose )
//    printf( "Consts = %6d. Classes = %6d. Literals = %6d.\n", 
//        Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );
//    Fra_ClassesPrint( p->pCla, 0 );
}